

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

void __thiscall Al::internal::ProgressEngine::engine(ProgressEngine *this)

{
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *this_00;
  __node_base *p_Var1;
  __int_type_conflict _Var2;
  __node_base *p_Var3;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *puVar4;
  InputQueue *pIVar5;
  int iVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  __node_base *p_Var9;
  iterator __position;
  iterator __position_00;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  long lVar10;
  int in_ESI;
  atomic<unsigned_long> *paVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  undefined1 auVar14 [16];
  AlState *req;
  ProgressEngine *local_e0;
  key_type local_d8;
  __node_base *local_d0;
  unique_lock<std::mutex> lock;
  string local_70;
  string local_50;
  
  bind(this,in_ESI,in_RDX,in_ECX);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->startup_mutex);
  LOCK();
  (this->started_flag)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::condition_variable::notify_all();
  this_00 = &this->run_queues;
  puVar4 = &this->run_queues;
  pIVar5 = this->request_queues;
  local_e0 = this;
  do {
    if (((this->stop_flag)._M_base._M_i & 1U) != 0) {
      return;
    }
    _Var12 = (this->num_input_streams).super___atomic_base<unsigned_long>._M_i;
    paVar11 = &(pIVar5->q).back;
    while (bVar13 = _Var12 != 0, _Var12 = _Var12 - 1, p_Var9 = &(puVar4->_M_h)._M_before_begin,
          this = local_e0, bVar13) {
      _Var2 = paVar11[-0x10].super___atomic_base<unsigned_long>._M_i;
      if (((paVar11->super___atomic_base<unsigned_long>)._M_i != _Var2) &&
         (req = (*(AlState ***)(paVar11 + -0x1f))[_Var2], req != (AlState *)0x0)) {
        iVar6 = (**(code **)(*(long *)req + 0x28))();
        if (iVar6 != 1) {
          if (iVar6 != 0) goto LAB_0010d6dd;
          if (3 < local_e0->num_bounded) {
            lock._M_device = (mutex_type *)(**(code **)(*(long *)req + 0x20))();
            sVar7 = std::
                    _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::count(&this_00->_M_h,&lock._M_device);
            if (sVar7 != 0) {
              local_d8 = (key_type)(**(code **)(*(long *)req + 0x20))();
              pmVar8 = std::__detail::
                       _Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_d8);
              if (pmVar8->_M_elems[0].
                  super__Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  pmVar8->_M_elems[0].
                  super__Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_0010d6dd;
            }
          }
          local_e0->num_bounded = local_e0->num_bounded + 1;
        }
        lock._M_device = (mutex_type *)(**(code **)(*(long *)req + 0x20))();
        sVar7 = std::
                _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&this_00->_M_h,&lock._M_device);
        if (sVar7 == 0) {
          local_d8 = (key_type)(**(code **)(*(long *)req + 0x20))();
          lock._M_device = (mutex_type *)0x0;
          lock._M_owns = false;
          lock._9_7_ = 0;
          std::
          _Hashtable<void*,std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>,std::allocator<std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<void*,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>
                    ((_Hashtable<void*,std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>,std::allocator<std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,&local_d8,&lock);
          std::
          array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
          ::~array((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                    *)&lock);
        }
        lock._M_device = (mutex_type *)(**(code **)(*(long *)req + 0x20))();
        pmVar8 = std::__detail::
                 _Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,&lock._M_device);
        std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::push_back
                  (pmVar8->_M_elems,&req);
        (**(code **)(*(long *)req + 0x10))();
        paVar11[-0x10].super___atomic_base<unsigned_long>._M_i =
             ((SPSCQueue<Al::internal::AlState_*> *)(paVar11 + -0x20))->size - 1 &
             paVar11[-0x10].super___atomic_base<unsigned_long>._M_i + 1;
      }
LAB_0010d6dd:
      paVar11 = paVar11 + 0x40;
    }
    while (p_Var3 = p_Var9->_M_nxt, p_Var3 != (__node_base *)0x0) {
      lVar10 = 0;
      local_d0 = p_Var3;
LAB_0010d70f:
      p_Var9 = local_d0;
      if (lVar10 != 2) {
        p_Var9 = p_Var3 + lVar10 * 3 + 2;
        p_Var1 = p_Var3 + lVar10 * 3 + 2;
        __position._M_current = (AlState **)p_Var1->_M_nxt;
        lVar10 = lVar10 + 1;
LAB_0010d736:
        do {
          if (__position._M_current == *(pointer *)(p_Var9 + 1)) goto LAB_0010d7c3;
          lock._M_device = (mutex_type *)*__position._M_current;
          if (*(AlState *)((long)lock._M_device + 9) != (AlState)0x1) {
            iVar6 = (**(code **)(*(long *)lock._M_device + 0x18))();
            if (iVar6 == 2) {
              iVar6 = (**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 0x28))
                                ();
              if (iVar6 == 0) {
                this->num_bounded = this->num_bounded - 1;
              }
              if (lock._M_device != (mutex_type *)0x0) {
                (**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 8))();
              }
LAB_0010d7b0:
              __position = std::
                           vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                           ::erase((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                                    *)p_Var9,__position._M_current);
              goto LAB_0010d736;
            }
            if (iVar6 == 1) {
              if (__position._M_current ==
                  (((_Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                     *)&p_Var9->_M_nxt)->_M_impl).super__Vector_impl_data._M_start) {
                std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                push_back((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                           *)(p_Var1 + 3),(value_type *)&lock);
                goto LAB_0010d7b0;
              }
              ((lock._M_device)->super___mutex_base)._M_mutex.__size[9] = '\x01';
            }
            else if (iVar6 != 0) {
              auVar14 = __cxa_allocate_exception(0x70);
              build_string<char_const(&)[17]>(&local_50,(Al *)"Unknown PEAction",auVar14._8_8_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/progress.cpp"
                         ,(allocator<char> *)&req);
              al_exception::al_exception(auVar14._0_8_,&local_50,&local_70,0x26d);
              __cxa_throw(auVar14._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
            }
          }
          __position._M_current = __position._M_current + 1;
        } while( true );
      }
    }
  } while( true );
LAB_0010d7c3:
  __position_00._M_current =
       (((_Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
        &p_Var9->_M_nxt)->_M_impl).super__Vector_impl_data._M_start;
  while ((this = local_e0, __position_00._M_current != __position._M_current &&
         (lock._M_device = (mutex_type *)*__position_00._M_current,
         *(AlState *)((long)lock._M_device + 9) == (AlState)0x1))) {
    *(AlState *)((long)lock._M_device + 9) = (AlState)0x0;
    std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::push_back
              ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
               (p_Var1 + 3),(value_type *)&lock);
    __position_00 =
         std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::erase
                   ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
                    p_Var9,__position_00._M_current);
    __position._M_current = *(AlState ***)(p_Var9 + 1);
  }
  goto LAB_0010d70f;
}

Assistant:

void ProgressEngine::engine() {
#ifdef AL_HAS_CUDA
  // Set the current CUDA device for the thread.
  AL_CHECK_CUDA_NOSYNC(AlGpuSetDevice(cur_device.load()));
#endif
#ifdef AL_USE_HWLOC
  bind();
#endif
  // Notify the main thread we're now running.
  {
    std::unique_lock<std::mutex> lock(startup_mutex);
    started_flag = true;
  }
#ifdef AL_PE_START_ON_DEMAND
  startup_cv.notify_all();
#else
  startup_cv.notify_one();
#endif
  while (!stop_flag.load(std::memory_order_acquire)) {
    // Check for newly-submitted requests.
    size_t cur_input_streams = num_input_streams.load();
    for (size_t i = 0; i < cur_input_streams; ++i) {
      AlState* req = request_queues[i].q.peek();
      if (req != nullptr) {
        // Add to the correct run queue if one is available.
        bool do_start = false;
        switch (req->get_run_type()) {
        case RunType::bounded:
          // Move to the run queue if any of the following hold:
          //   1. num_bounded < AL_PE_NUM_CONCURRENT_OPS.
          //   2. The run_queue for this stream doesn't exist.
          //   3. The run_queue for this stream's first stage is empty.
          if (num_bounded < AL_PE_NUM_CONCURRENT_OPS
              || !run_queues.count(req->get_compute_stream())
              || !run_queues[req->get_compute_stream()][0].size()) {
            ++num_bounded;
            do_start = true;
          }
          break;
        case RunType::unbounded:
          do_start = true;
          break;
        }
        if (do_start) {
          // Add to end of first pipeline stage.
          // Create run queues if needed.
          if (!run_queues.count(req->get_compute_stream())) {
            run_queues.emplace(req->get_compute_stream(),
                               decltype(run_queues)::mapped_type{});
          }
          run_queues[req->get_compute_stream()][0].push_back(req);
          req->start();
#ifdef AL_DEBUG_HANG_CHECK
          req->start_time = get_time();
#endif
#ifdef AL_TRACE
          trace::record_pe_start(*req);
#endif
          request_queues[i].q.pop_always();
        }
      }
    }
    // Process one step of each in-progress request.
    for (auto&& stream_pipeline_pair : run_queues) {
      auto&& pipeline = stream_pipeline_pair.second;
      for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
        // Process this stage of the pipeline.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          // Simply skip over paused states.
          if (req->paused_for_advance) {
            ++i;
          } else {
            PEAction action = req->step();
            switch (action) {
            case PEAction::cont:
              // Nothing to do here.
#ifdef AL_DEBUG_HANG_CHECK
              // Check whether we have hung.
              if (!req->hang_reported) {
                double t = get_time();
                if (t - req->start_time > 10.0 + world_comm->rank()) {
                  std::cout << world_comm->rank()
                            << ": Progress engine detected a possible hang"
                            << " state=" << req << " " << req->get_name()
                            << " compute_stream=" << req->get_compute_stream()
                            << " run_type="
                            << (req->get_run_type() == RunType::bounded ? "bounded" : "unbounded")
                            << std::endl;
                  req->hang_reported = true;
                }
              }
#endif
              ++i;
              break;
            case PEAction::advance:
#ifdef AL_DEBUG
              // Ensure we don't advance too far.
              if (stage + 1 >= AL_PE_NUM_PIPELINE_STAGES) {
                throw_al_exception("Trying to advance pipeline stage too far");
              }
#endif
              // Only move if this is the head of the pipeline stage.
              if (i == pipeline[stage].begin()) {
                pipeline[stage+1].push_back(req);
                i = pipeline[stage].erase(i);
              } else {
                req->paused_for_advance = true;
                ++i;
              }
              break;
            case PEAction::complete:
              if (req->get_run_type() == RunType::bounded) {
                --num_bounded;
              }
#ifdef AL_TRACE
              trace::record_pe_done(*req);
#endif
              delete req;
              i = pipeline[stage].erase(i);
              break;
            default:
              throw_al_exception("Unknown PEAction");
              break;
            }
          }
        }
        // Check whether we can advance paused states.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          if (req->paused_for_advance) {
            // Move to the next stage.
            req->paused_for_advance = false;
            pipeline[stage+1].push_back(req);
            i = pipeline[stage].erase(i);
          } else {
            break;  // Nothing at the head to advance.
          }
        }
      }
    }
  }
}